

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_bson.hpp
# Opt level: O0

type jsoncons::bson::
     decode_bson<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,(anonymous_namespace)::MyIterator>
               (MyIterator first,MyIterator last,bson_decode_options *options)

{
  error_code ec;
  bool bVar1;
  undefined8 uVar2;
  error_code *in_RCX;
  error_code *visitor;
  void *__buf;
  undefined8 extraout_RDX;
  int __fd;
  basic_bson_reader<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
  *in_RDI;
  type tVar3;
  basic_bson_reader<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
  reader;
  json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>,_void>
  adaptor;
  json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>
  decoder;
  json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_stack_fffffffffffffdc8;
  json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_stack_fffffffffffffdd0;
  bson_decode_options *in_stack_fffffffffffffdd8;
  conv_errc __e;
  error_code *this;
  binary_iterator_source<(anonymous_namespace)::MyIterator> *source;
  basic_bson_reader<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
  *buf_size;
  ser_error *this_00;
  MyIterator *first_00;
  binary_iterator_source<(anonymous_namespace)::MyIterator> *in_stack_fffffffffffffe10;
  temp_allocator_type *in_stack_fffffffffffffe20;
  json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_stack_fffffffffffffe28;
  json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_stack_fffffffffffffe30;
  basic_bson_reader<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
  local_1a0;
  undefined1 local_a2 [2];
  json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>
  local_a0;
  error_code *local_20;
  
  this_00 = (ser_error *)(local_a2 + 1);
  buf_size = in_RDI;
  local_20 = in_RCX;
  std::allocator<char>::allocator();
  first_00 = (MyIterator *)local_a2;
  std::allocator<char>::allocator();
  json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::json_decoder(in_stack_fffffffffffffe30,(allocator_type *)in_stack_fffffffffffffe28,
                 in_stack_fffffffffffffe20);
  std::allocator<char>::~allocator((allocator<char> *)local_a2);
  std::allocator<char>::~allocator((allocator<char> *)(local_a2 + 1));
  make_json_visitor_adaptor<jsoncons::basic_json_visitor<char>,jsoncons::json_decoder<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::allocator<char>>>
            (in_stack_fffffffffffffdc8);
  binary_iterator_source<(anonymous_namespace)::MyIterator>::binary_iterator_source
            (in_stack_fffffffffffffe10,first_00,(MyIterator *)this_00,(size_t)buf_size);
  source = (binary_iterator_source<(anonymous_namespace)::MyIterator> *)&stack0xfffffffffffffe27;
  visitor = local_20;
  std::allocator<char>::allocator();
  __fd = (int)&stack0xfffffffffffffe28;
  this = visitor;
  basic_bson_reader<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,std::allocator<char>>
  ::basic_bson_reader<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>>
            (in_RDI,source,(json_visitor *)visitor,in_stack_fffffffffffffdd8,
             (allocator<char> *)in_stack_fffffffffffffdd0);
  __e = (conv_errc)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe27);
  binary_iterator_source<(anonymous_namespace)::MyIterator>::~binary_iterator_source
            ((binary_iterator_source<(anonymous_namespace)::MyIterator> *)0x284439);
  basic_bson_reader<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
  ::read(&local_1a0,__fd,__buf,(size_t)visitor);
  bVar1 = json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>
          ::is_valid(&local_a0);
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x58);
    std::error_code::error_code<jsoncons::conv_errc,void>(this,__e);
    basic_bson_reader<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
    ::line((basic_bson_reader<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
            *)0x284488);
    basic_bson_reader<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
    ::column((basic_bson_reader<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
              *)0x28449c);
    ec._M_cat = (error_category *)in_stack_fffffffffffffe10;
    ec._0_8_ = first_00;
    ser_error::ser_error(this_00,ec,(size_t)buf_size,(size_t)in_RDI);
    __cxa_throw(uVar2,&ser_error::typeinfo,ser_error::~ser_error);
  }
  json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::get_result(in_stack_fffffffffffffe28);
  basic_bson_reader<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
  ::~basic_bson_reader
            ((basic_bson_reader<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
              *)0x2845c6);
  json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>,_void>
  ::~json_visitor_adaptor
            ((json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>,_void>
              *)0x2845d3);
  json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::~json_decoder(in_stack_fffffffffffffdd0);
  tVar3.field_0.int64_.val_ = extraout_RDX;
  tVar3.field_0._0_8_ = buf_size;
  return (type)tVar3.field_0;
}

Assistant:

typename std::enable_if<ext_traits::is_basic_json<T>::value,T>::type 
    decode_bson(InputIt first, InputIt last,
                const bson_decode_options& options = bson_decode_options())
    {
        jsoncons::json_decoder<T> decoder;
        auto adaptor = make_json_visitor_adaptor<json_visitor>(decoder);
        basic_bson_reader<binary_iterator_source<InputIt>> reader(binary_iterator_source<InputIt>(first, last), adaptor, options);
        reader.read();
        if (!decoder.is_valid())
        {
            JSONCONS_THROW(ser_error(conv_errc::conversion_failed, reader.line(), reader.column()));
        }
        return decoder.get_result();
    }